

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_drawMarks(void)

{
  FTexture *tex;
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 10; local_c = local_c + 1) {
    if ((markpoints[local_c].x != -1.0) || (NAN(markpoints[local_c].x))) {
      tex = FTextureManager::operator()(&TexMan,(FTextureID)marknums[local_c].texnum,false);
      DrawMarker(tex,markpoints[local_c].x,markpoints[local_c].y,-3,0,1.0,1.0,0,1.0,0,
                 LegacyRenderStyles[1]);
    }
  }
  return;
}

Assistant:

void AM_drawMarks ()
{
	for (int i = 0; i < AM_NUMMARKPOINTS; i++)
	{
		if (markpoints[i].x != -1)
		{
			DrawMarker (TexMan(marknums[i]), markpoints[i].x, markpoints[i].y, -3, 0,
				1, 1, 0, 1, 0, LegacyRenderStyles[STYLE_Normal]);
		}
	}
}